

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzload.c
# Opt level: O0

_Bool typesequiv(state *sp,int a,int b)

{
  int iVar1;
  ttinfo *ptVar2;
  ttinfo *ptVar3;
  _Bool local_31;
  ttinfo *bp;
  ttinfo *ap;
  _Bool result;
  int b_local;
  int a_local;
  state *sp_local;
  
  if ((((sp == (state *)0x0) || (a < 0)) || (sp->typecnt <= a)) || ((b < 0 || (sp->typecnt <= b))))
  {
    ap._7_1_ = false;
  }
  else {
    ptVar2 = sp->ttis + a;
    ptVar3 = sp->ttis + b;
    local_31 = false;
    if (((ptVar2->utoff == ptVar3->utoff) &&
        ((local_31 = false, (ptVar2->isdst & 1U) == (ptVar3->isdst & 1U) &&
         (local_31 = false, (ptVar2->ttisstd & 1U) == (ptVar3->ttisstd & 1U))))) &&
       (local_31 = false, (ptVar2->ttisut & 1U) == (ptVar3->ttisut & 1U))) {
      iVar1 = strcmp(sp->chars + ptVar2->desigidx,sp->chars + ptVar3->desigidx);
      local_31 = iVar1 == 0;
    }
    ap._7_1_ = local_31;
  }
  return ap._7_1_;
}

Assistant:

static bool typesequiv( const struct state * sp, int a, int b )
{
    bool result;

    if ( sp == NULL ||
         a < 0 || a >= sp->typecnt ||
         b < 0 || b >= sp->typecnt )
    {
        result = false;
    }
    else
    {
        const struct ttinfo *  ap = &sp->ttis[ a ];
        const struct ttinfo *  bp = &sp->ttis[ b ];

        result = ( ap->utoff == bp->utoff &&
                   ap->isdst == bp->isdst &&
                   ap->ttisstd == bp->ttisstd &&
                   ap->ttisut == bp->ttisut &&
                   ( strcmp( &sp->chars[ ap->desigidx ], &sp->chars[ bp->desigidx ] ) == 0 )
                 );
    }

    return result;
}